

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateMostDenseSeeds.cpp
# Opt level: O3

void RandomTrial(uint N,uint count,uint64_t seed,uint16_t d_seed,uint trial)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  WirehairResult WVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Codec codec;
  Codec CStack_128;
  
  uVar1 = ((ulong)trial + 1) * 0x5851f42d4c957f2d + seed * -0x4f5c17a566d501a4 + 1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1 * 0x5851f42d4c957f2d + 1 + seed * 2;
  auVar6 = vpunpcklqdq_avx(auVar5,auVar6);
  auVar5 = vpsrlvq_avx2(auVar6,_DAT_00109010);
  auVar2 = vpsrlvq_avx2(auVar6,_DAT_00109020);
  auVar6 = vpsrlq_avx(auVar6,0x3b);
  auVar6 = vpshufd_avx(auVar6,0xe8);
  auVar5 = vpshufd_avx(auVar2 ^ auVar5,0xe8);
  auVar5 = vprorvd_avx512vl(auVar5,auVar6);
  auVar6 = vpshufd_avx(auVar5,0x55);
  uVar4 = vpextrw_avx(auVar5 ^ auVar6,0);
  wirehair::Codec::Codec(&CStack_128);
  wirehair::Codec::OverrideSeeds(&CStack_128,(uint16_t)count,(uint16_t)uVar4,d_seed);
  WVar3 = wirehair::Codec::InitializeEncoder(&CStack_128,(ulong)N,1);
  if (WVar3 == Wirehair_Success) {
    WVar3 = wirehair::Codec::EncodeFeed
                      (&CStack_128,
                       message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    if (WVar3 == Wirehair_Success) goto LAB_00101ace;
  }
  LOCK();
  FailedTrials.super___atomic_base<unsigned_int>._M_i =
       (__atomic_base<unsigned_int>)((int)FailedTrials.super___atomic_base<unsigned_int>._M_i + 1);
  UNLOCK();
LAB_00101ace:
  wirehair::Codec::~Codec(&CStack_128);
  return;
}

Assistant:

static void RandomTrial(
    unsigned N,
    unsigned count,
    uint64_t seed,
    const uint16_t d_seed,
    unsigned trial)
{
    const uint16_t dense_count = (uint16_t)count;

    siamese::PCGRandom prng;
    prng.Seed(seed, trial);

    const uint16_t p_seed = (uint16_t)(prng.Next() ^ prng.Next());

    wirehair::Codec codec;

    // Override the seeds
    codec.OverrideSeeds(dense_count, p_seed, d_seed);

    // Initialize codec
    WirehairResult result = codec.InitializeEncoder(N, 1);

    // If initialization succeeded:
    if (result == Wirehair_Success) {
        // Feed message to codec
        result = codec.EncodeFeed(&message[0]);
    }

    if (result != Wirehair_Success) {
        FailedTrials++;
    }
}